

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O0

_Bool wiz_create_item_subaction(menu *m,ui_event *e,wchar_t oid)

{
  int iVar1;
  void *pvVar2;
  command *pcVar3;
  wchar_t selected;
  int *choices;
  wchar_t oid_local;
  ui_event *e_local;
  menu *m_local;
  
  pvVar2 = menu_priv(m);
  iVar1 = *(int *)((long)pvVar2 + (long)oid * 4);
  if (e->type == EVT_SELECT) {
    if ((iVar1 == -9999) && ((choose_artifact & 1U) == 0)) {
      cmdq_push(CMD_WIZ_CREATE_ALL_OBJ_FROM_TVAL);
      pcVar3 = cmdq_peek();
      cmd_set_arg_number(pcVar3,"tval",*(wchar_t *)((long)pvVar2 + (long)(oid + L'\x01') * 4));
      pcVar3 = cmdq_peek();
      cmd_set_arg_choice(pcVar3,"choice",L'\0');
    }
    else if ((iVar1 == -9999) && ((choose_artifact & 1U) != 0)) {
      cmdq_push(CMD_WIZ_CREATE_ALL_ARTIFACT_FROM_TVAL);
      pcVar3 = cmdq_peek();
      cmd_set_arg_number(pcVar3,"tval",*(wchar_t *)((long)pvVar2 + (long)(oid + L'\x01') * 4));
    }
    else if ((iVar1 == -9999) || ((choose_artifact & 1U) != 0)) {
      if ((iVar1 != -9999) && ((choose_artifact & 1U) != 0)) {
        cmdq_push(CMD_WIZ_CREATE_ARTIFACT);
        pcVar3 = cmdq_peek();
        cmd_set_arg_number(pcVar3,"index",*(wchar_t *)((long)pvVar2 + (long)oid * 4));
      }
    }
    else {
      cmdq_push(CMD_WIZ_CREATE_OBJ);
      pcVar3 = cmdq_peek();
      cmd_set_arg_number(pcVar3,"index",*(wchar_t *)((long)pvVar2 + (long)oid * 4));
    }
    m_local._7_1_ = false;
  }
  else {
    m_local._7_1_ = true;
  }
  return m_local._7_1_;
}

Assistant:

static bool wiz_create_item_subaction(struct menu *m, const ui_event *e,
	int oid)
{
	int *choices = menu_priv(m);
	int selected = choices[oid];

	if (e->type != EVT_SELECT) return true;

	if (selected == WIZ_CREATE_ALL_MENU_ITEM && !choose_artifact) {
		cmdq_push(CMD_WIZ_CREATE_ALL_OBJ_FROM_TVAL);
		/* Same hack as in wiz_create_item_subdisplay() to get tval. */
		cmd_set_arg_number(cmdq_peek(), "tval", choices[oid + 1]);
		cmd_set_arg_choice(cmdq_peek(), "choice", 0);
	} else if (selected == WIZ_CREATE_ALL_MENU_ITEM && choose_artifact) {
		cmdq_push(CMD_WIZ_CREATE_ALL_ARTIFACT_FROM_TVAL);
		cmd_set_arg_number(cmdq_peek(), "tval", choices[oid + 1]);
	} else if (selected != WIZ_CREATE_ALL_MENU_ITEM && !choose_artifact) {
		cmdq_push(CMD_WIZ_CREATE_OBJ);
		cmd_set_arg_number(cmdq_peek(), "index", choices[oid]);
	} else if (selected != WIZ_CREATE_ALL_MENU_ITEM && choose_artifact) {
		cmdq_push(CMD_WIZ_CREATE_ARTIFACT);
		cmd_set_arg_number(cmdq_peek(), "index", choices[oid]);
	}

	return false;
}